

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  cmSourceFile *pcVar4;
  pointer pcVar5;
  cmMakefile *pcVar6;
  _Alloc_hider infile;
  _Alloc_hider outfile;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  FileFormat FVar11;
  string *psVar12;
  char *pcVar13;
  char *pcVar14;
  string *psVar15;
  char *pcVar16;
  long *plVar17;
  cmMakefile *pcVar18;
  size_t sVar19;
  mapped_type *pmVar20;
  cmGeneratorTarget *pcVar21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var22;
  char **ppcVar23;
  ostream *poVar24;
  _Base_ptr p_Var25;
  _Rb_tree_node_base *p_Var26;
  size_type *psVar27;
  iterator it;
  undefined8 uVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar30;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar31;
  string inputFile;
  string outputFile;
  string opts;
  size_type __dnew_2;
  mode_t perm;
  string rcc_output_dir;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRccFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configIncludes;
  string absFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipUic;
  string autogenTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocHeaders;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipMoc;
  string targetDir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configDefines;
  string local_508;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  string local_488;
  cmGeneratorTarget *local_468;
  string local_460;
  cmMakefile *local_440;
  undefined1 local_438 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  cmMakefile *local_3f0;
  cmMakefile *local_3e8;
  char *local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_398;
  undefined1 local_380 [32];
  _Rb_tree_node_base *local_360;
  size_t local_358;
  undefined1 local_350 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Base_ptr local_330;
  size_t local_328;
  ios_base local_258 [264];
  cmLocalGenerator *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_440 = target->Target->Makefile;
  cmMakefile::PushScope(local_440);
  local_468 = target;
  GetAutogenTargetName_abi_cxx11_(&local_128,target);
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"_moc_target_name","");
  cmOutputConverter::EscapeForCMake((string *)local_380,&local_128);
  cmMakefile::AddDefinition(local_440,(string *)local_350,(char *)local_380._0_8_);
  pcVar16 = local_380 + 0x10;
  if ((char *)local_380._0_8_ != pcVar16) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"_origin_target_name","");
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_468);
  cmOutputConverter::EscapeForCMake((string *)local_380,psVar12);
  cmMakefile::AddDefinition(local_440,(string *)local_350,(char *)local_380._0_8_);
  if ((char *)local_380._0_8_ != pcVar16) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  GetAutogenTargetDir_abi_cxx11_(&local_b0,local_468);
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"Qt5Core_VERSION_MAJOR","");
  pcVar13 = cmMakefile::GetDefinition(local_440,(string *)local_350);
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  if (pcVar13 == (char *)0x0) {
    local_350 = (undefined1  [8])&local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"QT_VERSION_MAJOR","");
    pcVar13 = cmMakefile::GetDefinition(local_440,(string *)local_350);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"QT_MAJOR_VERSION","");
  local_3e0 = "";
  local_380._0_8_ = pcVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"");
  pcVar14 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                      (local_468,(string *)local_350,(string *)local_380);
  if ((char *)local_380._0_8_ != pcVar16) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  if (pcVar14 != (char *)0x0) {
    pcVar13 = pcVar14;
  }
  if (pcVar13 != (char *)0x0) {
    local_350 = (undefined1  [8])&local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"_target_qt_version","");
    cmMakefile::AddDefinition(local_440,(string *)local_350,pcVar13);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
  }
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380._24_8_ = local_380 + 8;
  local_380._8_4_ = _S_red;
  local_380._16_8_ = 0;
  local_358 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_360 = (_Rb_tree_node_base *)local_380._24_8_;
  local_350 = (undefined1  [8])&local_340;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"AUTOMOC","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_468,(string *)local_350);
  bVar9 = true;
  if (!bVar8) {
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"AUTOUIC","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_468,&local_508);
    bVar9 = true;
    if (!bVar8) {
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"AUTORCC","");
      bVar9 = cmGeneratorTarget::GetPropertyAsBool(local_468,&local_4e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  if (bVar9 != false) {
    local_3f0 = local_468->Target->Makefile;
    local_438._0_8_ = (string *)0x0;
    local_438._8_8_ = (string *)0x0;
    local_438[0x10] = '\0';
    local_438._17_6_ = 0;
    local_438[0x17] = '\0';
    cmGeneratorTarget::GetConfigCommonSourceFiles
              (local_468,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_438);
    local_418._M_allocated_capacity = 0;
    local_418._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._M_allocated_capacity = 0;
    if (local_438._0_8_ != local_438._8_8_) {
      paVar1 = &local_4a8.field_2;
      psVar12 = (string *)local_438._0_8_;
      do {
        pcVar4 = (cmSourceFile *)(psVar12->_M_dataplus)._M_p;
        psVar15 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
        cmsys::SystemTools::GetRealPath((string *)local_350,psVar15,(string *)0x0);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_508.field_2._M_allocated_capacity = 0x5455415f50494b53;
        local_508.field_2._8_4_ = 0x434f4d4f;
        local_508._M_string_length = 0xc;
        local_508.field_2._M_local_buf[0xc] = '\0';
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,&local_508);
        bVar8 = cmSystemTools::IsOn(pcVar16);
        local_3e8 = (cmMakefile *)CONCAT71(local_3e8._1_7_,bVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_508.field_2._M_allocated_capacity = 0x45544152454e4547;
        local_508._M_string_length = 9;
        local_508.field_2._8_2_ = 0x44;
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,&local_508);
        bVar8 = cmSystemTools::IsOn(pcVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_508.field_2._M_allocated_capacity = 0x5455415f50494b53;
        local_508.field_2._8_4_ = 0x4349554f;
        local_508._M_string_length = 0xc;
        local_508.field_2._M_local_buf[0xc] = '\0';
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,&local_508);
        bVar9 = cmSystemTools::IsOn(pcVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if (bVar9) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,(value_type *)local_350);
        }
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar4);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        pcVar5 = (psVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_508,pcVar5,pcVar5 + psVar15->_M_string_length);
        local_4e8.field_2._M_allocated_capacity = 0x4343524f545541;
        local_4e8._M_string_length = 7;
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        bVar9 = cmGeneratorTarget::GetPropertyAsBool(local_468,&local_4e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((bVar9) && (iVar10 = std::__cxx11::string::compare((char *)&local_508), iVar10 == 0)) {
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
          local_4e8.field_2._M_allocated_capacity = 0x5455415f50494b53;
          local_4e8.field_2._8_4_ = 0x4343524f;
          local_4e8._M_string_length = 0xc;
          local_4e8.field_2._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,&local_4e8);
          bVar9 = cmSystemTools::IsOn(pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          if (!bVar9) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_4e8,(string *)local_350);
            cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_460,local_468);
            cmsys::SystemTools::MakeDirectory(local_460._M_dataplus._M_p);
            local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_488,local_460._M_dataplus._M_p,
                       local_460._M_dataplus._M_p + local_460._M_string_length);
            std::operator+(&local_4c8,"/qrc_",&local_4e8);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_4c8);
            psVar27 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_4a8.field_2._M_allocated_capacity = *psVar27;
              local_4a8.field_2._8_8_ = plVar17[3];
              local_4a8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_4a8.field_2._M_allocated_capacity = *psVar27;
              local_4a8._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_4a8._M_string_length = plVar17[1];
            *plVar17 = (long)psVar27;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
              operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1
                             );
            }
            local_4c8._M_dataplus._M_p = (pointer)0x1b;
            local_4a8._M_dataplus._M_p = (pointer)paVar1;
            local_4a8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a8,(ulong)&local_4c8);
            local_4a8.field_2._M_allocated_capacity = (size_type)local_4c8._M_dataplus._M_p;
            builtin_strncpy((char *)((long)local_4a8._M_dataplus._M_p + 0xb),"MAKE_CLE",8);
            builtin_strncpy((char *)((long)local_4a8._M_dataplus._M_p + 0x13),"AN_FILES",8);
            *(undefined8 *)local_4a8._M_dataplus._M_p = 0x4e4f495449444441;
            *(undefined8 *)((long)local_4a8._M_dataplus._M_p + 8) = 0x5f454b414d5f4c41;
            local_4a8._M_string_length = (size_type)local_4c8._M_dataplus._M_p;
            local_4a8._M_dataplus._M_p[(long)local_4c8._M_dataplus._M_p] = '\0';
            cmMakefile::AppendProperty(local_3f0,&local_4a8,local_488._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_4a8._M_dataplus._M_p,
                              (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
            }
            cmMakefile::GetOrCreateSource(local_3f0,&local_488,true);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_418,&local_488);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != &local_488.field_2) {
              operator_delete(local_488._M_dataplus._M_p,
                              (ulong)(local_488.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._M_dataplus._M_p != &local_460.field_2) {
              operator_delete(local_460._M_dataplus._M_p,
                              (ulong)(local_460.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if (!bVar8) {
          if ((char)local_3e8 == '\0') {
            FVar11 = cmSystemTools::GetFileFormat(local_508._M_dataplus._M_p);
            this = &local_108;
            if (FVar11 != HEADER_FILE_FORMAT) {
              if (FVar11 != CXX_FILE_FORMAT) goto LAB_003e1860;
              this = &local_e8;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this,(value_type *)local_350);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_c8,(value_type *)local_350);
          }
        }
LAB_003e1860:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if (local_350 != (undefined1  [8])&local_340) {
          operator_delete((void *)local_350,
                          CONCAT17(local_340._M_local_buf[7],
                                   CONCAT61(local_340._M_allocated_capacity._1_6_,
                                            local_340._M_local_buf[0])) + 1);
        }
        psVar12 = (string *)&psVar12->_M_string_length;
        uVar28 = local_418._M_allocated_capacity;
      } while (psVar12 != (string *)local_438._8_8_);
      for (; uVar28 != local_418._8_8_;
          uVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar28 + 0x20)) {
        cmGeneratorTarget::AddSource(local_468,(string *)uVar28);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_418);
    if ((string *)local_438._0_8_ != (string *)0x0) {
      operator_delete((void *)local_438._0_8_,
                      CONCAT17(local_438[0x17],CONCAT61(local_438._17_6_,local_438[0x10])) -
                      local_438._0_8_);
    }
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"_cpp_files","");
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_4e8,&local_e8,";");
  cmOutputConverter::EscapeForCMake(&local_508,&local_4e8);
  cmMakefile::AddDefinition(local_440,(string *)local_350,local_508._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"AUTOMOC","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_468,(string *)local_350);
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  pcVar21 = local_468;
  if (bVar8) {
    pcVar18 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(local_468);
    pcVar6 = pcVar21->Target->Makefile;
    local_350 = (undefined1  [8])&local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"AUTOMOC_MOC_OPTIONS","");
    pcVar16 = cmGeneratorTarget::GetProperty(pcVar21,(string *)local_350);
    local_3f0 = pcVar18;
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    pcVar13 = "";
    if (pcVar16 != (char *)0x0) {
      pcVar13 = pcVar16;
    }
    local_350 = (undefined1  [8])&local_340;
    sVar19 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,pcVar13,pcVar13 + sVar19);
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508.field_2._M_allocated_capacity = 0x74706f5f636f6d5f;
    local_508.field_2._8_4_ = 0x736e6f69;
    local_508._M_string_length = 0xc;
    local_508.field_2._M_local_buf[0xc] = '\0';
    cmOutputConverter::EscapeForCMake(&local_4e8,(string *)local_350);
    pcVar21 = local_468;
    cmMakefile::AddDefinition(pcVar6,&local_508,local_4e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508.field_2._M_allocated_capacity = 0x6f6d5f70696b735f;
    local_508.field_2._8_2_ = 99;
    local_508._M_string_length = 9;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_460,&local_c8,";");
    cmOutputConverter::EscapeForCMake(&local_4e8,&local_460);
    cmMakefile::AddDefinition(pcVar6,&local_508,local_4e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508.field_2._M_allocated_capacity = 0x6165685f636f6d5f;
    local_508.field_2._8_4_ = 0x73726564;
    local_508._M_string_length = 0xc;
    local_508.field_2._M_local_buf[0xc] = '\0';
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_460,&local_108,";");
    cmOutputConverter::EscapeForCMake(&local_4e8,&local_460);
    cmMakefile::AddDefinition(pcVar6,&local_508,local_4e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_4e8._M_dataplus._M_p = (pointer)0x1a;
    local_508._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_4e8);
    local_508.field_2._M_allocated_capacity = (size_type)local_4e8._M_dataplus._M_p;
    builtin_strncpy(local_508._M_dataplus._M_p,"CMAKE_AUTOMOC_RELAXED_MODE",0x1a);
    local_508._M_string_length = (size_type)local_4e8._M_dataplus._M_p;
    local_508._M_dataplus._M_p[(long)local_4e8._M_dataplus._M_p] = '\0';
    bVar8 = cmMakefile::IsOn(pcVar6,&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_4e8._M_dataplus._M_p = (pointer)0x11;
    local_508._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_4e8);
    local_508.field_2._M_allocated_capacity = (size_type)local_4e8._M_dataplus._M_p;
    builtin_strncpy(local_508._M_dataplus._M_p,"_moc_relaxed_mode",0x11);
    local_508._M_string_length = (size_type)local_4e8._M_dataplus._M_p;
    local_508._M_dataplus._M_p[(long)local_4e8._M_dataplus._M_p] = '\0';
    pcVar16 = "FALSE";
    if (bVar8) {
      pcVar16 = "TRUE";
    }
    cmMakefile::AddDefinition(pcVar6,&local_508,pcVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_allocated_capacity =
         local_508.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    local_4e8._M_string_length = 0;
    local_4e8.field_2._M_allocated_capacity =
         local_4e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_438[0x10] = '\0';
    local_438._17_6_ = 0;
    local_438[0x17] = '\0';
    local_438._0_8_ = (string *)0x0;
    local_438._8_8_ = (string *)0x0;
    cmMakefile::GetConfigurations
              (&local_460,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_438,true);
    GetCompileDefinitionsAndDirectories(pcVar21,&local_460,&local_508,&local_4e8);
    paVar1 = &local_488.field_2;
    local_488.field_2._M_allocated_capacity = 0x636e695f636f6d5f;
    local_488.field_2._8_2_ = 0x73;
    local_488._M_string_length = 9;
    local_488._M_dataplus._M_p = (pointer)paVar1;
    cmOutputConverter::EscapeForCMake(&local_4a8,&local_508);
    cmMakefile::AddDefinition(pcVar6,&local_488,local_4a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar1) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    local_4a8._M_dataplus._M_p = (char *)0x11;
    local_488._M_dataplus._M_p = (pointer)paVar1;
    local_488._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_488,(ulong)&local_4a8);
    local_488.field_2._M_allocated_capacity = (size_type)local_4a8._M_dataplus._M_p;
    builtin_strncpy(local_488._M_dataplus._M_p,"_moc_compile_defs",0x11);
    local_488._M_string_length = (size_type)local_4a8._M_dataplus._M_p;
    local_488._M_dataplus._M_p[(long)local_4a8._M_dataplus._M_p] = '\0';
    cmOutputConverter::EscapeForCMake(&local_4a8,&local_4e8);
    cmMakefile::AddDefinition(pcVar6,&local_488,local_4a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
    }
    local_3e8 = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar1) {
      operator_delete(local_488._M_dataplus._M_p,
                      (ulong)(local_488.field_2._M_allocated_capacity + 1));
    }
    if (local_438._0_8_ != local_438._8_8_) {
      psVar12 = (string *)local_438._0_8_;
      do {
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        local_488._M_string_length = 0;
        local_488.field_2._M_allocated_capacity =
             local_488.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        local_4a8._M_string_length = 0;
        local_4a8.field_2._M_allocated_capacity =
             local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        GetCompileDefinitionsAndDirectories(local_468,psVar12,&local_488,&local_4a8);
        if ((local_488._M_string_length != local_508._M_string_length) ||
           (((char *)local_488._M_string_length != (char *)0x0 &&
            (iVar10 = bcmp(local_488._M_dataplus._M_p,local_508._M_dataplus._M_p,
                           local_488._M_string_length), iVar10 != 0)))) {
          cmOutputConverter::EscapeForCMake(&local_4c8,&local_488);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_380,psVar12);
          std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_4c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_508._M_string_length == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_508);
          }
        }
        if ((local_4a8._M_string_length != local_4e8._M_string_length) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4a8._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar10 = bcmp(local_4a8._M_dataplus._M_p,local_4e8._M_dataplus._M_p,
                           local_4a8._M_string_length), iVar10 != 0)))) {
          cmOutputConverter::EscapeForCMake(&local_4c8,&local_4a8);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,psVar12);
          std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_4c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_4e8._M_string_length == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_4e8);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,
                          (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,
                          (ulong)(local_488.field_2._M_allocated_capacity + 1));
        }
        psVar12 = psVar12 + 1;
      } while (psVar12 != (string *)local_438._8_8_);
    }
    paVar1 = &local_488.field_2;
    local_4a8._M_dataplus._M_p = (pointer)0x12;
    local_488._M_dataplus._M_p = (pointer)paVar1;
    local_488._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_488,(ulong)&local_4a8);
    pcVar6 = local_3e8;
    local_488.field_2._M_allocated_capacity = (size_type)local_4a8._M_dataplus._M_p;
    *(undefined8 *)local_488._M_dataplus._M_p = 0x5f7465677261745f;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 8) = 'q';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 9) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 10) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0xb) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0xc) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0x10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p + 0x11) = 'n';
    local_488._M_string_length = (size_type)local_4a8._M_dataplus._M_p;
    local_488._M_dataplus._M_p[(long)local_4a8._M_dataplus._M_p] = '\0';
    pcVar16 = cmMakefile::GetDefinition(local_3e8,&local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar1) {
      operator_delete(local_488._M_dataplus._M_p,
                      (ulong)(local_488.field_2._M_allocated_capacity + 1));
    }
    if (*pcVar16 == '4') {
      if (pcVar16[1] != '\0') goto LAB_003e22f1;
      local_488.field_2._M_allocated_capacity = 0x636f6d3a3a347451;
      local_488._M_string_length = 8;
      local_488.field_2._8_2_ = (ushort)(byte)local_488.field_2._M_local_buf[9] << 8;
      local_488._M_dataplus._M_p = (pointer)paVar1;
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_3f0,&local_488)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar1) {
        operator_delete(local_488._M_dataplus._M_p,
                        (ulong)(local_488.field_2._M_allocated_capacity + 1));
      }
      if (pcVar21 != (cmGeneratorTarget *)0x0) {
        local_4a8._M_dataplus._M_p = (pointer)0x12;
        local_488._M_dataplus._M_p = (pointer)paVar1;
        local_488._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_488,(ulong)&local_4a8);
        local_488.field_2._M_allocated_capacity = (size_type)local_4a8._M_dataplus._M_p;
        *(undefined8 *)local_488._M_dataplus._M_p = 0x5f636f6d5f74715f;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 9) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xc) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xf) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0x10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0x11) = 'e';
        local_488._M_string_length = (size_type)local_4a8._M_dataplus._M_p;
        local_488._M_dataplus._M_p[(long)local_4a8._M_dataplus._M_p] = '\0';
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        local_4a8._M_string_length = 0;
        local_4a8.field_2._M_allocated_capacity =
             local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&local_4a8);
        cmMakefile::AddDefinition(pcVar6,&local_488,pcVar16);
        goto LAB_003e4202;
      }
      cmSystemTools::Error
                ("Qt4::moc target not found ",local_128._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    else if ((*pcVar16 == '5') && (pcVar16[1] == '\0')) {
      local_488.field_2._M_allocated_capacity = 0x636f6d3a3a357451;
      local_488._M_string_length = 8;
      local_488.field_2._8_2_ = (ushort)(byte)local_488.field_2._M_local_buf[9] << 8;
      local_488._M_dataplus._M_p = (pointer)paVar1;
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_3f0,&local_488)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar1) {
        operator_delete(local_488._M_dataplus._M_p,
                        (ulong)(local_488.field_2._M_allocated_capacity + 1));
      }
      if (pcVar21 == (cmGeneratorTarget *)0x0) {
        cmSystemTools::Error
                  ("Qt5::moc target not found ",local_128._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      }
      else {
        local_4a8._M_dataplus._M_p = (pointer)0x12;
        local_488._M_dataplus._M_p = (pointer)paVar1;
        local_488._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_488,(ulong)&local_4a8);
        local_488.field_2._M_allocated_capacity = (size_type)local_4a8._M_dataplus._M_p;
        *(undefined8 *)local_488._M_dataplus._M_p = 0x5f636f6d5f74715f;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 9) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xc) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0xf) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0x10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p + 0x11) = 'e';
        local_488._M_string_length = (size_type)local_4a8._M_dataplus._M_p;
        local_488._M_dataplus._M_p[(long)local_4a8._M_dataplus._M_p] = '\0';
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        local_4a8._M_string_length = 0;
        local_4a8.field_2._M_allocated_capacity =
             local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&local_4a8);
        cmMakefile::AddDefinition(pcVar6,&local_488,pcVar16);
LAB_003e4202:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,
                          (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != paVar1) {
          operator_delete(local_488._M_dataplus._M_p,
                          (ulong)(local_488.field_2._M_allocated_capacity + 1));
        }
      }
    }
    else {
LAB_003e22f1:
      cmSystemTools::Error
                ("The CMAKE_AUTOMOC feature supports only Qt 4 and Qt 5 ",local_128._M_dataplus._M_p
                 ,(char *)0x0,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"AUTOUIC","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_468,(string *)local_350);
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  pcVar21 = local_468;
  if (!bVar8) goto LAB_003e2d77;
  local_150 = cmGeneratorTarget::GetLocalGenerator(local_468);
  pbVar30 = local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pcVar6 = pcVar21->Target->Makefile;
  local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((ulong)local_348 & 0xffffffff00000000);
  local_340._M_local_buf[0] = '\0';
  local_340._M_allocated_capacity._1_6_ = 0;
  local_340._M_local_buf[7] = '\0';
  local_340._8_2_ = SUB82((_Base_ptr)&local_348,0);
  local_340._M_local_buf[10] = (char)((ulong)&local_348 >> 0x10);
  local_340._M_local_buf[0xb] = (char)((ulong)&local_348 >> 0x18);
  local_340._M_local_buf[0xc] = (char)((ulong)&local_348 >> 0x20);
  local_340._13_2_ = (undefined2)((ulong)&local_348 >> 0x28);
  local_340._M_local_buf[0xf] = (char)((ulong)&local_348 >> 0x38);
  local_328 = 0;
  local_330 = (_Base_ptr)&local_348;
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __v = local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_508._M_dataplus._M_p = (pointer)local_350;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_350,(_Base_ptr)&local_348,__v,(_Alloc_node *)&local_508);
      __v = __v + 1;
    } while (__v != pbVar30);
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508.field_2._M_allocated_capacity = 0x69755f70696b735f;
  local_508.field_2._8_2_ = 99;
  local_508._M_string_length = 9;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_460,&local_148,";");
  cmOutputConverter::EscapeForCMake(&local_4e8,&local_460);
  pcVar21 = local_468;
  cmMakefile::AddDefinition(pcVar6,&local_508,local_4e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,(ulong)(local_460.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::GetQtUiFilesWithOptions
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_418,pcVar6);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_4e8._M_dataplus._M_p = (pointer)0x12;
  local_508._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_4e8);
  local_508.field_2._M_allocated_capacity = (size_type)local_4e8._M_dataplus._M_p;
  builtin_strncpy(local_508._M_dataplus._M_p,"_target_qt_version",0x12);
  local_508._M_string_length = (size_type)local_4e8._M_dataplus._M_p;
  local_508._M_dataplus._M_p[(long)local_4e8._M_dataplus._M_p] = '\0';
  local_3e8 = (cmMakefile *)cmMakefile::GetDefinition(pcVar6,&local_508);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,(ulong)(local_508.field_2._M_allocated_capacity + 1))
    ;
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508._M_string_length = 0;
  local_508.field_2._M_allocated_capacity =
       local_508.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmMakefile::GetConfigurations
            (&local_4e8,pcVar6,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_398,true);
  GetUicOpts(pcVar21,&local_4e8,&local_508);
  if ((char *)local_508._M_string_length != (char *)0x0) {
    cmOutputConverter::EscapeForCMake(&local_460,&local_508);
    std::__cxx11::string::operator=((string *)&local_508,(string *)&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    local_488._M_dataplus._M_p = (pointer)0x13;
    local_460._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)&local_488);
    local_460.field_2._M_allocated_capacity = (size_type)local_488._M_dataplus._M_p;
    builtin_strncpy(local_460._M_dataplus._M_p,"_uic_target_options",0x13);
    local_460._M_string_length = (size_type)local_488._M_dataplus._M_p;
    local_460._M_dataplus._M_p[(long)local_488._M_dataplus._M_p] = '\0';
    cmMakefile::AddDefinition(pcVar6,&local_460,local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
  }
  local_3f0 = pcVar6;
  if (local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar12 = (string *)
              local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      local_460._M_string_length = 0;
      local_460.field_2._M_allocated_capacity =
           local_460.field_2._M_allocated_capacity & 0xffffffffffffff00;
      GetUicOpts(local_468,psVar12,&local_460);
      if ((local_460._M_string_length != local_508._M_string_length) ||
         (((char *)local_460._M_string_length != (char *)0x0 &&
          (iVar10 = bcmp(local_460._M_dataplus._M_p,local_508._M_dataplus._M_p,
                         local_460._M_string_length), iVar10 != 0)))) {
        cmOutputConverter::EscapeForCMake(&local_488,&local_460);
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,psVar12);
        std::__cxx11::string::operator=((string *)pmVar20,(string *)&local_488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,
                          (ulong)(local_488.field_2._M_allocated_capacity + 1));
        }
        if ((char *)local_508._M_string_length == (char *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_508);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,
                        (ulong)(local_460.field_2._M_allocated_capacity + 1));
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 !=
             (string *)
             local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_460._M_string_length = 0;
  local_460.field_2._M_allocated_capacity =
       local_460.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488._M_string_length = 0;
  local_488.field_2._M_allocated_capacity =
       local_488.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_418._M_allocated_capacity != local_418._8_8_) {
    uVar28 = local_418._M_allocated_capacity;
    do {
      pcVar4 = *(cmSourceFile **)uVar28;
      psVar12 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&local_4a8,psVar12,(string *)0x0);
      pVar31 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)local_350,&local_4a8);
      if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::__cxx11::string::append((char *)&local_460);
        std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_4a8._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_488);
        local_438._24_7_ = 0x534e4f4954504f;
        local_438[0x10] = 'A';
        local_438._17_6_ = 0x4349554f5455;
        local_438[0x17] = '_';
        local_438._8_8_ = (string *)0xf;
        local_438[0x1f] = '\0';
        local_438._0_8_ = (string *)(local_438 + 0x10);
        pcVar16 = cmSourceFile::GetProperty(pcVar4,(string *)local_438);
        std::__cxx11::string::string((string *)&local_4c8,pcVar16,(allocator *)&local_3d8);
        if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
          operator_delete((void *)local_438._0_8_,
                          CONCAT17(local_438[0x17],CONCAT61(local_438._17_6_,local_438[0x10])) + 1);
        }
        cmsys::SystemTools::ReplaceString(&local_4c8,";","@list_sep@");
        std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        local_3e0 = ";";
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
      }
      uVar28 = uVar28 + 8;
    } while (uVar28 != local_418._8_8_);
  }
  paVar2 = &local_4a8.field_2;
  local_4c8._M_dataplus._M_p = (char *)0x15;
  local_4a8._M_dataplus._M_p = (pointer)paVar2;
  local_4a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a8,(ulong)&local_4c8);
  local_4a8.field_2._M_allocated_capacity = (size_type)local_4c8._M_dataplus._M_p;
  builtin_strncpy(local_4a8._M_dataplus._M_p,"_qt_uic_options_files",0x15);
  local_4a8._M_string_length = (size_type)local_4c8._M_dataplus._M_p;
  local_4a8._M_dataplus._M_p[(long)local_4c8._M_dataplus._M_p] = '\0';
  cmOutputConverter::EscapeForCMake(&local_4c8,&local_460);
  pcVar18 = local_3e8;
  pcVar6 = local_3f0;
  cmMakefile::AddDefinition(local_3f0,&local_4a8,local_4c8._M_dataplus._M_p);
  paVar1 = &local_4c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8._M_dataplus._M_p,(ulong)(local_4a8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_4c8._M_dataplus._M_p = (pointer)0x17;
  local_4a8._M_dataplus._M_p = (pointer)paVar2;
  local_4a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a8,(ulong)&local_4c8);
  local_4a8.field_2._M_allocated_capacity = (size_type)local_4c8._M_dataplus._M_p;
  builtin_strncpy(local_4a8._M_dataplus._M_p,"_qt_uic_options_options",0x17);
  local_4a8._M_string_length = (size_type)local_4c8._M_dataplus._M_p;
  local_4a8._M_dataplus._M_p[(long)local_4c8._M_dataplus._M_p] = '\0';
  cmOutputConverter::EscapeForCMake(&local_4c8,&local_488);
  cmMakefile::AddDefinition(pcVar6,&local_4a8,local_4c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8._M_dataplus._M_p,(ulong)(local_4a8.field_2._M_allocated_capacity + 1))
    ;
  }
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_468);
  pcVar5 = (psVar12->_M_dataplus)._M_p;
  local_4a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,pcVar5,pcVar5 + psVar12->_M_string_length);
  cVar3 = *(char *)&(pcVar18->CMP0054ReportedIds)._M_t._M_impl;
  if (cVar3 == '4') {
    if ((pcVar18->CMP0054ReportedIds)._M_t._M_impl.field_0x1 != '\0') goto LAB_003e2c8f;
    local_4c8.field_2._M_allocated_capacity = 0x6369753a3a347451;
    local_4c8._M_string_length = 8;
    local_4c8.field_2._M_local_buf[8] = '\0';
    local_4c8._M_dataplus._M_p = (pointer)paVar1;
    pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(local_150,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar21 != (cmGeneratorTarget *)0x0) {
      local_438._0_8_ = (pointer)0x12;
      local_4c8._M_dataplus._M_p = (pointer)paVar1;
      local_4c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c8,(ulong)local_438);
      local_4c8.field_2._M_allocated_capacity = local_438._0_8_;
      *(undefined8 *)local_4c8._M_dataplus._M_p = 0x5f6369755f74715f;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 9) = 'x';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xc) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xd) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0x10) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0x11) = 'e';
      local_4c8._M_string_length = local_438._0_8_;
      local_4c8._M_dataplus._M_p[local_438._0_8_] = '\0';
      local_438._8_8_ = (string *)0x0;
      local_438[0x10] = '\0';
      local_438._0_8_ = (string *)(local_438 + 0x10);
      pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,(string *)local_438);
      cmMakefile::AddDefinition(pcVar6,&local_4c8,pcVar16);
      goto LAB_003e431f;
    }
    cmSystemTools::Error
              ("Qt4::uic target not found ",local_4a8._M_dataplus._M_p,(char *)0x0,(char *)0x0);
  }
  else if ((cVar3 == '5') && ((pcVar18->CMP0054ReportedIds)._M_t._M_impl.field_0x1 == '\0')) {
    local_4c8.field_2._M_allocated_capacity = 0x6369753a3a357451;
    local_4c8._M_string_length = 8;
    local_4c8.field_2._M_local_buf[8] = '\0';
    local_4c8._M_dataplus._M_p = (pointer)paVar1;
    pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(local_150,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar21 != (cmGeneratorTarget *)0x0) {
      local_438._0_8_ = (pointer)0x12;
      local_4c8._M_dataplus._M_p = (pointer)paVar1;
      local_4c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c8,(ulong)local_438);
      local_4c8.field_2._M_allocated_capacity = local_438._0_8_;
      *(undefined8 *)local_4c8._M_dataplus._M_p = 0x5f6369755f74715f;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 9) = 'x';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xc) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xd) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0x10) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p + 0x11) = 'e';
      local_4c8._M_string_length = local_438._0_8_;
      local_4c8._M_dataplus._M_p[local_438._0_8_] = '\0';
      local_438._8_8_ = (string *)0x0;
      local_438[0x10] = '\0';
      local_438._0_8_ = (string *)(local_438 + 0x10);
      pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar21,(string *)local_438);
      cmMakefile::AddDefinition(pcVar6,&local_4c8,pcVar16);
LAB_003e431f:
      if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_,
                        CONCAT17(local_438[0x17],CONCAT61(local_438._17_6_,local_438[0x10])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
LAB_003e2c8f:
    cmSystemTools::Error
              ("The CMAKE_AUTOUIC feature supports only Qt 4 and Qt 5 ",local_4a8._M_dataplus._M_p,
               (char *)0x0,(char *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8._M_dataplus._M_p,(ulong)(local_4a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,(ulong)(local_488.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,(ulong)(local_460.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_418._M_allocated_capacity,
                    local_408._M_allocated_capacity - local_418._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_350);
LAB_003e2d77:
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"AUTORCC","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_468,(string *)local_350);
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  if (bVar8) {
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_allocated_capacity =
         local_508.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar6 = local_468->Target->Makefile;
    local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(local_468,&local_398);
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    local_4e8._M_string_length = 0;
    local_4e8.field_2._M_allocated_capacity =
         local_4e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    local_460._M_string_length = 0;
    local_460.field_2._M_allocated_capacity =
         local_460.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    local_488._M_string_length = 0;
    local_488.field_2._M_allocated_capacity =
         local_488.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_4a8._M_dataplus._M_p = (pointer)0x12;
    local_350 = (undefined1  [8])&local_340;
    local_350 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4a8);
    local_340._M_local_buf[0] = (char)local_4a8._M_dataplus._M_p;
    local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4a8._M_dataplus._M_p >> 8);
    local_340._M_local_buf[7] = (char)((ulong)local_4a8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_350 = 0x5f7465677261745f;
    *(char *)((long)local_350 + 8) = 'q';
    *(char *)((long)local_350 + 9) = 't';
    *(char *)((long)local_350 + 10) = '_';
    *(char *)((long)local_350 + 0xb) = 'v';
    *(char *)((long)local_350 + 0xc) = 'e';
    *(char *)((long)local_350 + 0xd) = 'r';
    *(char *)((long)local_350 + 0xe) = 's';
    *(char *)((long)local_350 + 0xf) = 'i';
    *(char *)((long)local_350 + 0x10) = 'o';
    *(char *)((long)local_350 + 0x11) = 'n';
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p;
    *(char *)((long)local_350 + (long)local_4a8._M_dataplus._M_p) = '\0';
    cmMakefile::GetDefinition(pcVar6,(string *)local_350);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340._M_local_buf[0] = 'A';
    local_340._M_allocated_capacity._1_6_ = 0x4343524f5455;
    local_340._M_local_buf[7] = '_';
    local_340._8_2_ = 0x504f;
    local_340._M_local_buf[10] = 'T';
    local_340._M_local_buf[0xb] = 'I';
    local_340._M_local_buf[0xc] = 'O';
    local_340._13_2_ = 0x534e;
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
    local_340._M_local_buf[0xf] = '\0';
    local_350 = (undefined1  [8])&local_340;
    pcVar16 = cmGeneratorTarget::GetProperty(local_468,(string *)local_350);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    if (pcVar16 != (char *)0x0) {
      local_350 = (undefined1  [8])&local_340;
      sVar19 = strlen(pcVar16);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_350,pcVar16,pcVar16 + sVar19);
      cmSystemTools::ExpandListArgument((string *)local_350,&local_3d8,false);
      if (local_350 != (undefined1  [8])&local_340) {
        operator_delete((void *)local_350,
                        CONCAT17(local_340._M_local_buf[7],
                                 CONCAT61(local_340._M_allocated_capacity._1_6_,
                                          local_340._M_local_buf[0])) + 1);
      }
    }
    local_4c8._M_dataplus._M_p = (pointer)0x10;
    local_350 = (undefined1  [8])&local_340;
    local_350 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4c8);
    local_340._M_local_buf[0] = (char)local_4c8._M_dataplus._M_p;
    local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4c8._M_dataplus._M_p >> 8);
    local_340._M_local_buf[7] = (char)((ulong)local_4c8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_350 = 0x49535245565f5451;
    *(char *)((long)local_350 + 8) = 'O';
    *(char *)((long)local_350 + 9) = 'N';
    *(char *)((long)local_350 + 10) = '_';
    *(char *)((long)local_350 + 0xb) = 'M';
    *(char *)((long)local_350 + 0xc) = 'A';
    *(char *)((long)local_350 + 0xd) = 'J';
    *(char *)((long)local_350 + 0xe) = 'O';
    *(char *)((long)local_350 + 0xf) = 'R';
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p;
    *(char *)((long)local_350 + (long)local_4c8._M_dataplus._M_p) = '\0';
    pcVar16 = cmMakefile::GetSafeDefinition(pcVar6,(string *)local_350);
    std::__cxx11::string::string((string *)&local_4a8,pcVar16,(allocator *)&local_4c8);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    iVar10 = std::__cxx11::string::compare((char *)&local_4a8);
    if (iVar10 == 0) {
      local_4c8._M_dataplus._M_p = (pointer)0x15;
      local_350 = (undefined1  [8])&local_340;
      local_350 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4c8);
      local_340._M_local_buf[0] = (char)local_4c8._M_dataplus._M_p;
      local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4c8._M_dataplus._M_p >> 8);
      local_340._M_local_buf[7] = (char)((ulong)local_4c8._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_350 = 0x5f65726f43357451;
      *(char *)((long)local_350 + 8) = 'V';
      *(char *)((long)local_350 + 9) = 'E';
      *(char *)((long)local_350 + 10) = 'R';
      *(char *)((long)local_350 + 0xb) = 'S';
      *(char *)((long)local_350 + 0xc) = 'I';
      *(char *)((long)local_350 + 0xd) = 'O';
      *(char *)((long)local_350 + 0xe) = 'N';
      *(char *)((long)local_350 + 0xf) = '_';
      *(char *)((long)local_350 + 0xd) = 'O';
      *(char *)((long)local_350 + 0xe) = 'N';
      *(char *)((long)local_350 + 0xf) = '_';
      *(char *)((long)local_350 + 0x10) = 'M';
      *(char *)((long)local_350 + 0x11) = 'A';
      *(char *)((long)local_350 + 0x12) = 'J';
      *(char *)((long)local_350 + 0x13) = 'O';
      *(char *)((long)local_350 + 0x14) = 'R';
      local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p;
      *(char *)((long)local_350 + (long)local_4c8._M_dataplus._M_p) = '\0';
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar6,(string *)local_350);
      sVar7 = local_4a8._M_string_length;
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)&local_4a8,0,(char *)sVar7,(ulong)pcVar16);
      if (local_350 != (undefined1  [8])&local_340) {
        operator_delete((void *)local_350,
                        CONCAT17(local_340._M_local_buf[7],
                                 CONCAT61(local_340._M_allocated_capacity._1_6_,
                                          local_340._M_local_buf[0])) + 1);
      }
    }
    local_3f0 = pcVar6;
    if (local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_3e8 = (cmMakefile *)0x50ff0f;
      local_3e0 = "";
      psVar12 = (string *)
                local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar4 = (cmSourceFile *)(psVar12->_M_dataplus)._M_p;
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar4);
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        pcVar5 = (psVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c8,pcVar5,pcVar5 + psVar15->_M_string_length);
        iVar10 = std::__cxx11::string::compare((char *)&local_4c8);
        bVar8 = true;
        if (iVar10 == 0) {
          psVar15 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
          cmsys::SystemTools::GetRealPath((string *)local_438,psVar15,(string *)0x0);
          local_350 = (undefined1  [8])&local_340;
          local_340._M_local_buf[0] = 'S';
          local_340._M_allocated_capacity._1_6_ = 0x55415f50494b;
          local_340._M_local_buf[7] = 'T';
          local_340._8_2_ = 0x524f;
          local_340._M_local_buf[10] = 'C';
          local_340._M_local_buf[0xb] = 'C';
          local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0xc;
          local_340._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,(string *)local_350);
          bVar9 = cmSystemTools::IsOn(pcVar16);
          if (local_350 != (undefined1  [8])&local_340) {
            operator_delete((void *)local_350,
                            CONCAT17(local_340._M_local_buf[7],
                                     CONCAT61(local_340._M_allocated_capacity._1_6_,
                                              local_340._M_local_buf[0])) + 1);
          }
          bVar8 = true;
          if (!bVar9) {
            std::__cxx11::string::append((char *)&local_508);
            std::__cxx11::string::_M_append((char *)&local_508,local_438._0_8_);
            local_340._8_2_ = 0x504f;
            local_340._M_local_buf[10] = 'T';
            local_340._M_local_buf[0xb] = 'I';
            local_340._M_local_buf[0xc] = 'O';
            local_340._13_2_ = 0x534e;
            local_340._M_local_buf[0] = 'A';
            local_340._M_allocated_capacity._1_6_ = 0x4343524f5455;
            local_340._M_local_buf[7] = '_';
            local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xf;
            local_340._M_local_buf[0xf] = '\0';
            local_350 = (undefined1  [8])&local_340;
            pcVar16 = cmSourceFile::GetProperty(pcVar4,(string *)local_350);
            if (local_350 != (undefined1  [8])&local_340) {
              operator_delete((void *)local_350,
                              CONCAT17(local_340._M_local_buf[7],
                                       CONCAT61(local_340._M_allocated_capacity._1_6_,
                                                local_340._M_local_buf[0])) + 1);
            }
            if (pcVar16 != (char *)0x0) {
              local_3b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
              local_3b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
              local_3b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_350 = (undefined1  [8])&local_340;
              sVar19 = strlen(pcVar16);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_350,pcVar16,pcVar16 + sVar19);
              cmSystemTools::ExpandListArgument((string *)local_350,&local_3b8,false);
              if (local_350 != (undefined1  [8])&local_340) {
                operator_delete((void *)local_350,
                                CONCAT17(local_340._M_local_buf[7],
                                         CONCAT61(local_340._M_allocated_capacity._1_6_,
                                                  local_340._M_local_buf[0])) + 1);
              }
              local_418._M_allocated_capacity = 0;
              local_418._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_408._M_allocated_capacity = 0;
              pbVar30 = local_3b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  _Var22 = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     (local_3d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      local_3d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,pbVar30);
                  if (_Var22._M_current ==
                      local_3d8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_418,pbVar30);
                  }
                  else {
                    local_350 = (undefined1  [8])&local_340;
                    pcVar5 = (pbVar30->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_350,pcVar5,pcVar5 + pbVar30->_M_string_length);
                    ppcVar23 = std::find_if<char_const*const*,cmStrCmp>
                                         ((char **)
                                                  MergeRccOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                                  ::valueOptions,(char **)Convert::DaysInMonth,
                                          (cmStrCmp *)local_350);
                    if (local_350 != (undefined1  [8])&local_340) {
                      operator_delete((void *)local_350,
                                      CONCAT17(local_340._M_local_buf[7],
                                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                                        local_340._M_local_buf[0])) + 1);
                    }
                    if (ppcVar23 != (char **)Convert::DaysInMonth) {
                      if (_Var22._M_current + 1 ==
                          local_3d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        __assert_fail("existingIt + 1 != opts.end()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmQtAutoGeneratorInitializer.cxx"
                                      ,0x1a7,
                                      "void MergeRccOptions(std::vector<std::string> &, const std::vector<std::string> &, bool)"
                                     );
                      }
                      pbVar30 = pbVar30 + 1;
                      std::__cxx11::string::_M_assign((string *)(_Var22._M_current + 1));
                    }
                  }
                  pbVar30 = pbVar30 + 1;
                } while (pbVar30 !=
                         local_3b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_3d8,
                         local_3d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_418._M_allocated_capacity)
              ;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_418);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_3b8);
            }
            if (local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::append((char *)&local_460);
              std::__cxx11::string::_M_append((char *)&local_460,local_438._0_8_);
              std::__cxx11::string::append((char *)&local_488);
              pbVar29 = local_3d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_3d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_3d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  std::__cxx11::string::append((char *)&local_488);
                  std::__cxx11::string::_M_append
                            ((char *)&local_488,(ulong)(pbVar29->_M_dataplus)._M_p);
                  pbVar29 = pbVar29 + 1;
                } while (pbVar29 !=
                         local_3d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
            local_3b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
            local_3b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
            local_3b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_350 = (undefined1  [8])&local_340;
            local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_340._M_local_buf[0] = '\0';
            local_418._M_allocated_capacity = (size_type)&local_408;
            local_408._M_allocated_capacity = 0x45544152454e4547;
            local_408._M_local_buf[8] = 'D';
            local_418._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x9;
            local_408._M_local_buf[9] = '\0';
            pcVar16 = cmSourceFile::GetPropertyForUser(pcVar4,(string *)&local_418);
            bVar8 = cmSystemTools::IsOn(pcVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              local_408._M_allocated_capacity + 1);
            }
            if (bVar8) {
LAB_003e3642:
              std::__cxx11::string::append((char *)&local_4e8);
              bVar8 = true;
              std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_350);
              local_3e8 = (cmMakefile *)0x4c3ad5;
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&local_4a8);
              if (iVar10 == 0) {
                ListQt5RccInputs((string *)&local_418,pcVar4,local_468,&local_3b8);
              }
              else {
                ListQt4RccInputs((string *)&local_418,pcVar4,&local_3b8);
              }
              std::__cxx11::string::operator=((string *)local_350,(string *)local_418._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_allocated_capacity != &local_408) {
                operator_delete((void *)local_418._M_allocated_capacity,
                                local_408._M_allocated_capacity + 1);
              }
              if (local_348 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_003e3642;
              bVar8 = false;
            }
            if (local_350 != (undefined1  [8])&local_340) {
              operator_delete((void *)local_350,
                              CONCAT17(local_340._M_local_buf[7],
                                       CONCAT61(local_340._M_allocated_capacity._1_6_,
                                                local_340._M_local_buf[0])) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3b8);
            local_3e0 = ";";
          }
          if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
            operator_delete((void *)local_438._0_8_,
                            CONCAT17(local_438[0x17],CONCAT61(local_438._17_6_,local_438[0x10])) + 1
                           );
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) goto LAB_003e3a68;
        psVar12 = (string *)&psVar12->_M_string_length;
      } while (psVar12 !=
               (string *)
               local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    pcVar21 = local_468;
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_468);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                   "_qt_rcc_inputs_",psVar12);
    cmOutputConverter::EscapeForCMake(&local_4c8,&local_4e8);
    pcVar6 = local_3f0;
    cmMakefile::AddDefinition(local_3f0,(string *)local_350,local_4c8._M_dataplus._M_p);
    paVar1 = &local_4c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    local_340._M_local_buf[0] = '_';
    local_340._M_allocated_capacity._1_6_ = 0x69665f636372;
    local_340._M_local_buf[7] = 'l';
    local_340._8_2_ = 0x7365;
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xa;
    local_340._M_local_buf[10] = '\0';
    local_350 = (undefined1  [8])&local_340;
    cmOutputConverter::EscapeForCMake(&local_4c8,&local_508);
    cmMakefile::AddDefinition(pcVar6,(string *)local_350,local_4c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    local_4c8._M_dataplus._M_p = (char *)0x15;
    local_350 = (undefined1  [8])&local_340;
    local_350 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4c8);
    local_340._M_local_buf[0] = (char)local_4c8._M_dataplus._M_p;
    local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4c8._M_dataplus._M_p >> 8);
    local_340._M_local_buf[7] = (char)((ulong)local_4c8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_350 = 0x5f6363725f74715f;
    *(char *)((long)local_350 + 8) = 'o';
    *(char *)((long)local_350 + 9) = 'p';
    *(char *)((long)local_350 + 10) = 't';
    *(char *)((long)local_350 + 0xb) = 'i';
    *(char *)((long)local_350 + 0xc) = 'o';
    *(char *)((long)local_350 + 0xd) = 'n';
    *(char *)((long)local_350 + 0xe) = 's';
    *(char *)((long)local_350 + 0xf) = '_';
    *(char *)((long)local_350 + 0xd) = 'n';
    *(char *)((long)local_350 + 0xe) = 's';
    *(char *)((long)local_350 + 0xf) = '_';
    *(char *)((long)local_350 + 0x10) = 'f';
    *(char *)((long)local_350 + 0x11) = 'i';
    *(char *)((long)local_350 + 0x12) = 'l';
    *(char *)((long)local_350 + 0x13) = 'e';
    *(char *)((long)local_350 + 0x14) = 's';
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p;
    *(char *)((long)local_350 + (long)local_4c8._M_dataplus._M_p) = '\0';
    cmOutputConverter::EscapeForCMake(&local_4c8,&local_460);
    cmMakefile::AddDefinition(pcVar6,(string *)local_350,local_4c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    local_4c8._M_dataplus._M_p = (char *)0x17;
    local_350 = (undefined1  [8])&local_340;
    local_350 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4c8);
    local_340._M_local_buf[0] = (char)local_4c8._M_dataplus._M_p;
    local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4c8._M_dataplus._M_p >> 8);
    local_340._M_local_buf[7] = (char)((ulong)local_4c8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_350 = 0x5f6363725f74715f;
    *(char *)((long)local_350 + 8) = 'o';
    *(char *)((long)local_350 + 9) = 'p';
    *(char *)((long)local_350 + 10) = 't';
    *(char *)((long)local_350 + 0xb) = 'i';
    *(char *)((long)local_350 + 0xc) = 'o';
    *(char *)((long)local_350 + 0xd) = 'n';
    *(char *)((long)local_350 + 0xe) = 's';
    *(char *)((long)local_350 + 0xf) = '_';
    *(char *)((long)local_350 + 0xf) = '_';
    *(char *)((long)local_350 + 0x10) = 'o';
    *(char *)((long)local_350 + 0x11) = 'p';
    *(char *)((long)local_350 + 0x12) = 't';
    *(char *)((long)local_350 + 0x13) = 'i';
    *(char *)((long)local_350 + 0x14) = 'o';
    *(char *)((long)local_350 + 0x15) = 'n';
    *(char *)((long)local_350 + 0x16) = 's';
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p;
    *(char *)((long)local_350 + (long)local_4c8._M_dataplus._M_p) = '\0';
    cmOutputConverter::EscapeForCMake(&local_4c8,&local_488);
    cmMakefile::AddDefinition(pcVar6,(string *)local_350,local_4c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
    local_4c8._M_dataplus._M_p = (pointer)0x12;
    local_350 = (undefined1  [8])&local_340;
    local_350 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_350,(ulong)&local_4c8);
    local_340._M_local_buf[0] = (char)local_4c8._M_dataplus._M_p;
    local_340._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_4c8._M_dataplus._M_p >> 8);
    local_340._M_local_buf[7] = (char)((ulong)local_4c8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_350 = 0x5f6363725f74715f;
    *(char *)((long)local_350 + 8) = 'e';
    *(char *)((long)local_350 + 9) = 'x';
    *(char *)((long)local_350 + 10) = 'e';
    *(char *)((long)local_350 + 0xb) = 'c';
    *(char *)((long)local_350 + 0xc) = 'u';
    *(char *)((long)local_350 + 0xd) = 't';
    *(char *)((long)local_350 + 0xe) = 'a';
    *(char *)((long)local_350 + 0xf) = 'b';
    *(char *)((long)local_350 + 0x10) = 'l';
    *(char *)((long)local_350 + 0x11) = 'e';
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p;
    *(char *)((long)local_350 + (long)local_4c8._M_dataplus._M_p) = '\0';
    GetRccExecutable_abi_cxx11_(&local_4c8,pcVar21);
    cmMakefile::AddDefinition(pcVar6,(string *)local_350,local_4c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT17(local_340._M_local_buf[7],
                               CONCAT61(local_340._M_allocated_capacity._1_6_,
                                        local_340._M_local_buf[0])) + 1);
    }
LAB_003e3a68:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,
                      (ulong)(local_488.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      (ulong)(local_460.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)
        local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_398.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_398.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_398.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
  }
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"CMAKE_ROOT","");
  pcVar16 = cmMakefile::GetSafeDefinition(local_440,(string *)local_350);
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  std::__cxx11::string::string((string *)&local_508,pcVar16,(allocator *)local_350);
  std::__cxx11::string::append((char *)&local_508);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_4e8);
  local_350 = (undefined1  [8])&local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"_qt_rcc_inputs","");
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_468);
  std::operator+(&local_460,"_qt_rcc_inputs_",psVar12);
  pcVar6 = local_440;
  pcVar16 = cmMakefile::GetDefinition(local_440,&local_460);
  cmMakefile::AddDefinition(pcVar6,(string *)local_350,pcVar16);
  paVar1 = &local_460.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,(ulong)(local_460.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_350 != (undefined1  [8])&local_340) {
    operator_delete((void *)local_350,
                    CONCAT17(local_340._M_local_buf[7],
                             CONCAT61(local_340._M_allocated_capacity._1_6_,
                                      local_340._M_local_buf[0])) + 1);
  }
  outfile._M_p = local_4e8._M_dataplus._M_p;
  infile._M_p = local_508._M_dataplus._M_p;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)local_350);
  cmMakefile::ConfigureFile
            (local_440,infile._M_p,outfile._M_p,false,true,false,(cmNewLineStyle *)local_350);
  local_488._M_dataplus._M_p = local_488._M_dataplus._M_p & 0xffffffff00000000;
  cmsys::SystemTools::GetPermissions(&local_4e8,(mode_t *)&local_488);
  if (-1 < (char)local_488._M_dataplus._M_p) {
    cmsys::SystemTools::SetPermissions(&local_4e8,(uint)local_488._M_dataplus._M_p | 0x80,false);
  }
  if (((local_60._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_358 != 0)) ||
     (local_90._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::ofstream::ofstream(local_350,local_4e8._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_330 + *(long *)((long)local_350 + -0x18)) & 5) == 0) {
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header &&
          local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var25 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_350,"set(AM_MOC_COMPILE_DEFINITIONS_",0x1f);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_350,*(char **)(p_Var25 + 1),
                               (long)p_Var25[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var25 + 2),(long)p_Var25[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
        } while ((_Rb_tree_header *)p_Var25 != &local_60._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_node_base *)local_380._24_8_ != (_Rb_tree_node_base *)(local_380 + 8) &&
          local_358 != 0) {
        p_Var26 = (_Rb_tree_node_base *)local_380._24_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_350,"set(AM_MOC_INCLUDES_",0x14);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_350,*(char **)(p_Var26 + 1),
                               (long)p_Var26[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var26 + 2),(long)p_Var26[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
        } while (p_Var26 != (_Rb_tree_node_base *)(local_380 + 8));
      }
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header &&
          local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var25 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_350,"set(AM_UIC_TARGET_OPTIONS_",0x1a);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_350,*(char **)(p_Var25 + 1),
                               (long)p_Var25[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24," ",1);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar24,*(char **)(p_Var25 + 2),(long)p_Var25[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,")\n",2);
          p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
        } while ((_Rb_tree_header *)p_Var25 != &local_90._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_460._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_460,"Internal CMake error when trying to open file: ","");
      std::__cxx11::string::append((char *)&local_460);
      std::__cxx11::string::append((char *)&local_460);
      cmSystemTools::Error(local_460._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != paVar1) {
        operator_delete(local_460._M_dataplus._M_p,
                        (ulong)(local_460.field_2._M_allocated_capacity + 1));
      }
    }
    local_350 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_350 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&local_348);
    std::ios_base::~ios_base(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::PopScope(local_440);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = GetAutogenTargetName(target);

  makefile->AddDefinition("_moc_target_name",
          cmOutputConverter::EscapeForCMake(autogenTargetName).c_str());
  makefile->AddDefinition("_origin_target_name",
          cmOutputConverter::EscapeForCMake(target->GetName()).c_str());

  std::string targetDir = GetAutogenTargetDir(target);

  const char *qtVersion = makefile->GetDefinition("Qt5Core_VERSION_MAJOR");
  if (!qtVersion)
    {
    qtVersion = makefile->GetDefinition("QT_VERSION_MAJOR");
    }
  if (const char *targetQtVersion =
      target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", ""))
    {
    qtVersion = targetQtVersion;
    }
  if (qtVersion)
    {
    makefile->AddDefinition("_target_qt_version", qtVersion);
    }

  std::vector<std::string> skipUic;
  std::vector<std::string> skipMoc;
  std::vector<std::string> mocSources;
  std::vector<std::string> mocHeaders;
  std::map<std::string, std::string> configIncludes;
  std::map<std::string, std::string> configDefines;
  std::map<std::string, std::string> configUicOptions;

  if (target->GetPropertyAsBool("AUTOMOC")
      || target->GetPropertyAsBool("AUTOUIC")
      || target->GetPropertyAsBool("AUTORCC"))
    {
    SetupSourceFiles(target, skipMoc, mocSources, mocHeaders, skipUic);
    }
  makefile->AddDefinition("_cpp_files",
          cmOutputConverter::EscapeForCMake(cmJoin(mocSources, ";")).c_str());
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    SetupAutoMocTarget(target, autogenTargetName,
                             skipMoc, mocHeaders,
                             configIncludes, configDefines);
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    SetupAutoUicTarget(target, skipUic, configUicOptions);
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    SetupAutoRccTarget(target);
    }

  const char* cmakeRoot = makefile->GetSafeDefinition("CMAKE_ROOT");
  std::string inputFile = cmakeRoot;
  inputFile += "/Modules/AutogenInfo.cmake.in";
  std::string outputFile = targetDir;
  outputFile += "/AutogenInfo.cmake";
  makefile->AddDefinition("_qt_rcc_inputs",
              makefile->GetDefinition("_qt_rcc_inputs_" + target->GetName()));
  makefile->ConfigureFile(inputFile.c_str(), outputFile.c_str(),
                          false, true, false);

  // Ensure we have write permission in case .in was read-only.
  mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  mode_t mode_write = S_IWRITE;
#else
  mode_t mode_write = S_IWUSR;
#endif
  cmSystemTools::GetPermissions(outputFile, perm);
  if (!(perm & mode_write))
    {
    cmSystemTools::SetPermissions(outputFile, perm | mode_write);
    }
  if (!configDefines.empty()
      || !configIncludes.empty()
      || !configUicOptions.empty())
    {
    cmsys::ofstream infoFile(outputFile.c_str(), std::ios::app);
    if ( !infoFile )
      {
      std::string error = "Internal CMake error when trying to open file: ";
      error += outputFile.c_str();
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
      return;
      }
    if (!configDefines.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configDefines.begin(), end = configDefines.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_COMPILE_DEFINITIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configIncludes.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configIncludes.begin(), end = configIncludes.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_INCLUDES_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configUicOptions.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configUicOptions.begin(), end = configUicOptions.end();
            it != end; ++it)
        {
        infoFile << "set(AM_UIC_TARGET_OPTIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    }
}